

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O2

void __thiscall Imaginer::Utils::iRpn::iRpn(iRpn *this,char *expname)

{
  int iVar1;
  iStack<char> *this_00;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_01;
  int local_18 [2];
  
  this->_expnames = expname;
  this->_curpos = 0;
  this_00 = (iStack<char> *)operator_new(0x10);
  local_18[1] = 0x400;
  iStack<char>::iStack(this_00,local_18 + 1);
  this->_operator = this_00;
  iVar1 = this_00->_top;
  this_00->_top = iVar1 + 1;
  this_00->_data[(long)iVar1 + 1] = '#';
  this_01 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)operator_new(0x10);
  local_18[0] = 0x400;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(this_01,local_18);
  this->_operands = this_01;
  return;
}

Assistant:

iRpn::iRpn(char* expname):_expnames(expname),_curpos(0)
{
    _operator = new iStack<char>;
    _operator->push('#');
    _operands = new iStack<RPNnode>;
}